

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

char16_t * PAL_wcsstr(char16_t *string,char16_t *strCharSet)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  int iVar3;
  char16_t cVar4;
  long lVar5;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strCharSet != (char16_t *)0x0 && string != (char16_t *)0x0) {
    if (*strCharSet == L'\0') {
      return string;
    }
    if (*string != L'\0') {
      pcVar2 = string;
      do {
        if (*strCharSet == L'\0') {
          return string;
        }
        iVar3 = 1;
        lVar5 = 0;
        cVar4 = *strCharSet;
        while( true ) {
          if (pcVar2[lVar5] == L'\0') {
            return (char16_t *)0x0;
          }
          if (pcVar2[lVar5] != cVar4) break;
          lVar5 = (long)iVar3;
          cVar4 = strCharSet[lVar5];
          iVar3 = iVar3 + 1;
          if (cVar4 == L'\0') {
            return pcVar2;
          }
        }
        pcVar1 = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
        if (*pcVar1 == L'\0') {
          return (char16_t *)0x0;
        }
      } while( true );
    }
  }
  return (char16_t *)0x0;
}

Assistant:

const char16_t *
__cdecl
PAL_wcsstr(
        const char16_t *string,
        const char16_t *strCharSet)
{
    char16_t *ret = NULL;
    int i;

    PERF_ENTRY(wcsstr);
    ENTRY("wcsstr (string=%p (%S), strCharSet=%p (%S))\n",
      string?string:W16_NULLSTRING,
      string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    if (string == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (strCharSet == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (*strCharSet == 0)
    {
        ret = (char16_t *)string;
        goto leave;
    }

    while (*string != 0)
    {
        i = 0;
        while (1)
        {
            if (*(strCharSet + i) == 0)
            {
                ret = (char16_t *) string;
                goto leave;
            }
            else if (*(string + i) == 0)
            {
                ret = NULL;
                goto leave;
            }
            if (*(string + i) != *(strCharSet + i))
            {
                break;
            }

            i++;
        }
        string++;
    }

 leave:
    LOGEXIT("wcsstr returning char16_t %p (%S)\n", ret?ret:W16_NULLSTRING, ret?ret:W16_NULLSTRING);
    PERF_EXIT(wcsstr);
    return ret;
}